

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *ci,_Bool httpheader,_Bool noexpire,
                        char *lineptr,char *domain,char *path,_Bool secure)

{
  uchar *puVar1;
  char cVar2;
  char cVar3;
  curl_trc_feat *pcVar4;
  Curl_easy *easy;
  _Bool _Var5;
  byte bVar6;
  _Bool _Var7;
  int iVar8;
  CURLofft CVar9;
  Cookie *co;
  size_t sVar10;
  void *pvVar11;
  char *pcVar12;
  char *pcVar13;
  time_t tVar14;
  long lVar15;
  size_t sVar16;
  psl_ctx_t *ppVar17;
  undefined7 in_register_00000009;
  curl_off_t *pcVar18;
  char *cookie_domain;
  size_t sVar19;
  int iVar20;
  CookieInfo *pCVar21;
  _Bool replaces;
  curl_off_t *local_288;
  char local_279;
  Curl_easy *local_278;
  curl_off_t *local_270;
  char *local_268;
  CookieInfo *local_260;
  undefined4 local_254;
  time_t local_250;
  long local_248;
  size_t local_240;
  char lcase [256];
  char local_138 [264];
  
  replaces = false;
  if (0x31 < (data->req).setcookies) {
    return (Cookie *)0x0;
  }
  local_254 = (undefined4)CONCAT71(in_register_00000009,noexpire);
  co = (Cookie *)(*Curl_ccalloc)(1,0x78);
  if (co == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  local_278 = data;
  local_268 = domain;
  local_260 = ci;
  if (httpheader) {
    sVar10 = strlen(lineptr);
    if (sVar10 < 0x1389) {
      local_250 = time((time_t *)0x0);
      local_270 = &co->expires;
      local_248 = 0x7fffffffffffffff - local_250;
LAB_0011d8d7:
      cVar2 = (char)*(curl_off_t *)lineptr;
      pcVar18 = (curl_off_t *)lineptr;
      if ((cVar2 != '\t') && (cVar2 != ' ')) {
        sVar10 = strcspn(lineptr,";\t\r\n=");
        if (sVar10 != 0) {
          pcVar18 = (curl_off_t *)(sVar10 + (long)lineptr);
          do {
            cVar3 = *(char *)((long)lineptr + (sVar10 - 1));
            if ((cVar3 != ' ') && (cVar3 != '\t')) goto LAB_0011d922;
            sVar10 = sVar10 - 1;
          } while (sVar10 != 0);
          sVar10 = 0;
LAB_0011d922:
          local_279 = (char)*pcVar18;
          if (local_279 == '=') {
            pcVar12 = (char *)((long)pcVar18 + 1);
            local_288 = pcVar18;
            local_240 = strcspn(pcVar12,";\r\n");
            for (sVar19 = local_240; sVar19 != 0; sVar19 = sVar19 - 1) {
              if ((*(char *)((long)local_288 + sVar19) != '\t') &&
                 (*(char *)((long)local_288 + sVar19) != ' ')) goto LAB_0011d970;
            }
            goto LAB_0011d986;
          }
          pcVar12 = (char *)0x0;
          sVar19 = 0;
          goto LAB_0011d9c1;
        }
        goto LAB_0011dd68;
      }
      goto LAB_0011dd8c;
    }
    goto LAB_0011e5a6;
  }
  lcase[0] = '\0';
  lcase[1] = '\0';
  lcase[2] = '\0';
  lcase[3] = '\0';
  lcase[4] = '\0';
  lcase[5] = '\0';
  lcase[6] = '\0';
  lcase[7] = '\0';
  iVar8 = strncmp(lineptr,"#HttpOnly_",10);
  if (iVar8 == 0) {
    lineptr = lineptr + 10;
    co->field_0x74 = co->field_0x74 | 8;
  }
  if (*lineptr == '#') goto LAB_0011e5a6;
  pcVar12 = strchr(lineptr,0xd);
  if (pcVar12 != (char *)0x0) {
    *pcVar12 = '\0';
  }
  pcVar12 = strchr(lineptr,10);
  if (pcVar12 != (char *)0x0) {
    *pcVar12 = '\0';
  }
  pcVar12 = strtok_r(lineptr,"\t",(char **)lcase);
  if (pcVar12 == (char *)0x0) goto LAB_0011e5a6;
  local_288 = &co->expires;
  iVar8 = 0;
  do {
    iVar20 = iVar8;
    switch(iVar8) {
    case 0:
      pcVar12 = (*Curl_cstrdup)(pcVar12 + (*pcVar12 == '.'));
      co->domain = pcVar12;
      iVar20 = 0;
      goto LAB_0011e01f;
    case 1:
      iVar8 = curl_strequal(pcVar12,"TRUE");
      bVar6 = co->field_0x74 & 0xfe | iVar8 != 0;
      iVar20 = 1;
      goto LAB_0011e0d3;
    case 2:
      iVar8 = strcmp("TRUE",pcVar12);
      if ((iVar8 == 0) || (iVar8 = strcmp("FALSE",pcVar12), iVar8 == 0)) {
        pcVar13 = (*Curl_cstrdup)("/");
        co->path = pcVar13;
        if (pcVar13 != (char *)0x0) {
          pcVar13 = (*Curl_cstrdup)("/");
          co->spath = pcVar13;
          if (pcVar13 != (char *)0x0) goto switchD_0011def3_caseD_3;
        }
      }
      else {
        pcVar12 = (*Curl_cstrdup)(pcVar12);
        co->path = pcVar12;
        if (pcVar12 != (char *)0x0) {
          pcVar12 = sanitize_cookie_path(pcVar12);
          co->spath = pcVar12;
          iVar20 = 2;
          goto LAB_0011e01f;
        }
      }
      goto LAB_0011e5a6;
    case 3:
switchD_0011def3_caseD_3:
      co->field_0x74 = co->field_0x74 & 0xfd;
      iVar8 = curl_strequal(pcVar12,"TRUE");
      if (iVar8 != 0) {
        if ((secure) || (local_260->running == true)) {
          bVar6 = co->field_0x74 | 2;
          iVar20 = 3;
          goto LAB_0011e0d3;
        }
        goto LAB_0011e5a6;
      }
      iVar20 = 3;
      break;
    case 4:
      CVar9 = curlx_strtoofft(pcVar12,(char **)0x0,10,local_288);
      iVar20 = 4;
      if (CVar9 != CURL_OFFT_OK) goto LAB_0011e5a6;
      break;
    case 5:
      pcVar12 = (*Curl_cstrdup)(pcVar12);
      co->name = pcVar12;
      if (pcVar12 == (char *)0x0) goto LAB_0011e5a6;
      iVar8 = curl_strnequal("__Secure-",pcVar12,9);
      if (iVar8 == 0) {
        iVar8 = curl_strnequal("__Host-",co->name,7);
        if (iVar8 == 0) {
          iVar20 = 5;
          break;
        }
        bVar6 = co->field_0x74 | 0x20;
      }
      else {
        bVar6 = co->field_0x74 | 0x10;
      }
      iVar20 = 5;
LAB_0011e0d3:
      co->field_0x74 = bVar6;
      break;
    case 6:
      pcVar12 = (*Curl_cstrdup)(pcVar12);
      co->value = pcVar12;
      iVar20 = 6;
LAB_0011e01f:
      if (pcVar12 == (char *)0x0) goto LAB_0011e5a6;
    }
    pcVar12 = strtok_r((char *)0x0,"\t",(char **)lcase);
    iVar8 = iVar20 + 1;
  } while (pcVar12 != (char *)0x0);
  if (iVar20 != 6) {
    if (iVar20 != 5) goto LAB_0011e5a6;
    pcVar12 = (*Curl_cstrdup)("");
    co->value = pcVar12;
    if (pcVar12 == (char *)0x0) goto LAB_0011e5a6;
  }
LAB_0011e202:
  pCVar21 = local_260;
  bVar6 = co->field_0x74;
  if ((((bVar6 & 0x12) == 0x10) ||
      (((bVar6 & 0x20) != 0 &&
       (((((bVar6 & 2) == 0 || (pcVar12 = co->path, pcVar12 == (char *)0x0)) || (*pcVar12 != '/'))
        || ((bVar6 & 1) != 0 || pcVar12[1] != '\0')))))) ||
     (((local_260->running == false && (local_260->newsession == true)) && (co->expires == 0))))
  goto LAB_0011e5a6;
  co->field_0x74 = bVar6 & 0xfb | local_260->running << 2;
  iVar8 = local_260->lastct + 1;
  local_260->lastct = iVar8;
  co->creationtime = iVar8;
  if ((char)local_254 == '\0') {
    remove_expired(local_260);
  }
  easy = local_278;
  if (((local_268 == (char *)0x0 || local_278 == (Curl_easy *)0x0) || (co->domain == (char *)0x0))
     || (_Var7 = Curl_host_is_ipnum(co->domain), _Var7)) {
LAB_0011e2a2:
    iVar8 = replace_existing(easy,co,pCVar21,secure,&replaces);
    if (iVar8 == 0) {
      sVar16 = cookiehash(co->domain);
      pCVar21 = local_260;
      Curl_llist_append(local_260->cookielist + sVar16,co,(Curl_llist_node *)co);
      if ((((easy != (Curl_easy *)0x0) && (pCVar21->running != false)) &&
          (((easy->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar4 = (easy->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        pcVar12 = "Added";
        if (replaces != false) {
          pcVar12 = "Replaced";
        }
        Curl_infof(easy,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld",pcVar12,co->name,
                   co->value,co->domain,co->path,co->expires);
      }
      if (replaces == false) {
        pCVar21->numcookies = pCVar21->numcookies + 1;
      }
      lVar15 = co->expires;
      if (lVar15 != 0) {
        if (lVar15 < pCVar21->next_expiration) {
          pCVar21->next_expiration = lVar15;
          return co;
        }
        return co;
      }
      return co;
    }
  }
  else {
    sVar10 = strlen(local_268);
    sVar19 = strlen(co->domain);
    if ((sVar10 < 0x100) && (sVar19 < 0x100)) {
      ppVar17 = Curl_psl_use(easy);
      if (ppVar17 == (psl_ctx_t *)0x0) {
        if ((((easy->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar4 = (easy->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          Curl_infof(easy,"libpsl problem, rejecting cookie for satety");
        }
      }
      else {
        Curl_strntolower(lcase,local_268,sVar10 + 1);
        Curl_strntolower(local_138,co->domain,sVar19 + 1);
        iVar8 = psl_is_cookie_domain_acceptable(ppVar17,lcase,local_138);
        Curl_psl_release(easy);
        pCVar21 = local_260;
        if (iVar8 != 0) goto LAB_0011e2a2;
      }
    }
    if ((((easy->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar4 = (easy->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))) {
      Curl_infof(easy,"cookie \'%s\' dropped, domain \'%s\' must not set cookies for \'%s\'",
                 co->name,local_268,co->domain);
    }
  }
LAB_0011e5a6:
  freecookie(co);
  return (Cookie *)0x0;
  while( true ) {
    pcVar12 = pcVar12 + 1;
    sVar19 = sVar19 - 1;
    if (sVar19 == 0) break;
LAB_0011d970:
    if ((*pcVar12 != ' ') && (*pcVar12 != '\t')) goto LAB_0011d989;
  }
LAB_0011d986:
  sVar19 = 0;
LAB_0011d989:
  pvVar11 = memchr(pcVar12,9,sVar19);
  if (pvVar11 != (void *)0x0) {
    if (((local_278 == (Curl_easy *)0x0) || (((local_278->set).field_0x8cd & 0x10) == 0)) ||
       ((pcVar4 = (local_278->state).feat, pcVar4 != (curl_trc_feat *)0x0 && (pcVar4->log_level < 1)
        ))) goto LAB_0011e5a6;
    pcVar12 = "cookie contains TAB, dropping";
    goto LAB_0011e531;
  }
  pcVar18 = (curl_off_t *)((long)local_288 + local_240 + 1);
LAB_0011d9c1:
  if (((0xffe < sVar10) || (0xffe < sVar19)) || (0x1000 < sVar19 + sVar10)) {
    if (((local_278 != (Curl_easy *)0x0) && (((local_278->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar4 = (local_278->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)
        ))) {
      Curl_infof(local_278,"oversized cookie dropped, name/val %zu + %zu bytes",sVar10,sVar19);
    }
    goto LAB_0011e5a6;
  }
  local_288 = pcVar18;
  if ((cVar2 == '_' && 6 < sVar10) && (*(char *)((long)lineptr + 1) == '_')) {
    iVar8 = curl_strnequal("__Secure-",lineptr,9);
    bVar6 = 0x10;
    if (iVar8 == 0) {
      iVar8 = curl_strnequal("__Host-",lineptr,7);
      bVar6 = 0x20;
      if (iVar8 == 0) goto LAB_0011da4a;
    }
    co->field_0x74 = co->field_0x74 | bVar6;
  }
LAB_0011da4a:
  if (co->name == (char *)0x0) {
    if (local_279 != '=') goto LAB_0011e5a6;
    (*Curl_cfree)((void *)0x0);
    pcVar13 = (char *)Curl_memdup0(lineptr,sVar10);
    co->name = pcVar13;
    (*Curl_cfree)(co->value);
    pcVar13 = (char *)Curl_memdup0(pcVar12,sVar19);
    co->value = pcVar13;
    pcVar12 = co->name;
    if ((pcVar12 == (char *)0x0) || (pcVar13 == (char *)0x0)) goto LAB_0011e5a6;
    sVar10 = strcspn(pcVar13,invalid_octets_badoctets);
    if ((pcVar13[sVar10] != '\0') ||
       (sVar10 = strcspn(pcVar12,invalid_octets_badoctets), pcVar18 = local_288,
       pcVar12[sVar10] != '\0')) {
      if (((local_278 == (Curl_easy *)0x0) || (((local_278->set).field_0x8cd & 0x10) == 0)) ||
         ((pcVar4 = (local_278->state).feat, pcVar4 != (curl_trc_feat *)0x0 &&
          (pcVar4->log_level < 1)))) goto LAB_0011e5a6;
      pcVar12 = "invalid octets in name/value, cookie dropped";
LAB_0011e531:
      Curl_infof(local_278,pcVar12);
      goto LAB_0011e5a6;
    }
    goto LAB_0011dd68;
  }
  if (sVar19 == 0) {
    if (sVar10 == 8) {
      iVar8 = curl_strnequal("httponly",lineptr,8);
      if (iVar8 != 0) {
        co->field_0x74 = co->field_0x74 | 8;
        pcVar18 = local_288;
        goto LAB_0011dd68;
      }
    }
    else if ((sVar10 == 6) && (iVar8 = curl_strnequal("secure",lineptr,6), iVar8 != 0)) {
      if ((!secure) && (local_260->running != false)) goto LAB_0011e5a6;
      co->field_0x74 = co->field_0x74 | 2;
      pcVar18 = local_288;
      goto LAB_0011dd68;
    }
    pcVar18 = local_288;
    if (local_279 != '=') goto LAB_0011dd68;
  }
  if (sVar10 != 7) {
    if (sVar10 == 6) {
      iVar8 = curl_strnequal("domain",lineptr,6);
      pcVar13 = local_268;
      pcVar18 = local_288;
      if ((sVar19 == 0) || (iVar8 == 0)) goto LAB_0011dd68;
      cookie_domain = pcVar12 + (*pcVar12 == '.');
      sVar16 = sVar19 - (*pcVar12 == '.');
      pcVar12 = local_268;
      if (local_268 == (char *)0x0) {
        pcVar12 = cookie_domain;
      }
      _Var7 = Curl_host_is_ipnum(pcVar12);
      if (pcVar13 != (char *)0x0) {
        if (_Var7) {
          iVar8 = strncmp(cookie_domain,local_268,sVar16);
          if ((iVar8 != 0) || (sVar10 = strlen(local_268), sVar16 != sVar10)) {
LAB_0011e5c5:
            if (((local_278 != (Curl_easy *)0x0) && (((local_278->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar4 = (local_278->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                (0 < pcVar4->log_level)))) {
              Curl_infof(local_278,"skipped cookie with bad tailmatch domain: %s",cookie_domain);
            }
            goto LAB_0011e5a6;
          }
        }
        else {
          _Var5 = cookie_tailmatch(cookie_domain,sVar16,local_268);
          if (!_Var5) goto LAB_0011e5c5;
        }
      }
      (*Curl_cfree)(co->domain);
      pcVar12 = (char *)Curl_memdup0(cookie_domain,sVar16);
      co->domain = pcVar12;
      if (pcVar12 != (char *)0x0 && !_Var7) {
        co->field_0x74 = co->field_0x74 | 1;
        pcVar18 = local_288;
        goto LAB_0011dd68;
      }
    }
    else {
      pcVar18 = local_288;
      if ((sVar10 != 4) ||
         (iVar8 = curl_strnequal("path",lineptr,4), pcVar18 = local_288, iVar8 == 0))
      goto LAB_0011dd68;
      (*Curl_cfree)(co->path);
      pcVar12 = (char *)Curl_memdup0(pcVar12,sVar19);
      co->path = pcVar12;
      if (pcVar12 == (char *)0x0) goto LAB_0011e5a6;
      (*Curl_cfree)(co->spath);
      pcVar12 = sanitize_cookie_path(co->path);
      co->spath = pcVar12;
    }
    pcVar18 = local_288;
    if (pcVar12 == (char *)0x0) goto LAB_0011e5a6;
    goto LAB_0011dd68;
  }
  iVar8 = curl_strnequal("version",lineptr,7);
  pcVar18 = local_288;
  if (iVar8 != 0) goto LAB_0011dd68;
  iVar8 = curl_strnequal("max-age",lineptr,7);
  if (iVar8 == 0) {
    iVar8 = curl_strnequal("expires",lineptr,7);
    pcVar18 = local_288;
    if ((iVar8 != 0) && (*local_270 == 0)) {
      tVar14 = Curl_getdate_capped(pcVar12);
      *local_270 = tVar14;
      pcVar18 = local_288;
      if (tVar14 == 0) {
        *local_270 = 1;
      }
      else if (tVar14 < 0) {
        *local_270 = 0;
      }
    }
    goto LAB_0011dd68;
  }
  CVar9 = curlx_strtoofft(pcVar12 + (*pcVar12 == '\"'),(char **)0x0,10,local_270);
  pcVar18 = local_288;
  if (CVar9 == CURL_OFFT_OK) {
    lVar15 = *local_270;
    if (lVar15 == 0) goto LAB_0011de19;
    if (local_248 < lVar15) goto LAB_0011de02;
    lVar15 = lVar15 + local_250;
  }
  else {
    if (CVar9 == CURL_OFFT_INVAL) {
LAB_0011de19:
      *local_270 = 1;
      goto LAB_0011dd68;
    }
    if (CVar9 != CURL_OFFT_FLOW) goto LAB_0011dd68;
LAB_0011de02:
    lVar15 = 0x7fffffffffffffff;
  }
  *local_270 = lVar15;
LAB_0011dd68:
  for (; (cVar2 = (char)*pcVar18, cVar2 == '\t' || (cVar2 == ' '));
      pcVar18 = (curl_off_t *)((long)pcVar18 + 1)) {
  }
  if (cVar2 != ';') goto LAB_0011e0fd;
LAB_0011dd8c:
  lineptr = (char *)((long)pcVar18 + 1);
  goto LAB_0011d8d7;
LAB_0011e0fd:
  if ((local_268 != (char *)0x0) && (co->domain == (char *)0x0)) {
    pcVar12 = (*Curl_cstrdup)(local_268);
    co->domain = pcVar12;
    if (pcVar12 == (char *)0x0) goto LAB_0011e5a6;
  }
  if ((path != (char *)0x0) && (co->path == (char *)0x0)) {
    pcVar12 = strchr(path,0x3f);
    if (pcVar12 == (char *)0x0) {
      pcVar12 = strrchr(path,0x2f);
    }
    else {
      pcVar12 = (char *)memrchr(path,0x2f,(long)pcVar12 - (long)path);
    }
    if (pcVar12 != (char *)0x0) {
      pcVar12 = (char *)Curl_memdup0(path,(size_t)(pcVar12 + (1 - (long)path)));
      co->path = pcVar12;
      if (pcVar12 == (char *)0x0) goto LAB_0011e5a6;
      pcVar12 = sanitize_cookie_path(pcVar12);
      co->spath = pcVar12;
      if (pcVar12 == (char *)0x0) goto LAB_0011e5a6;
    }
  }
  if (co->name == (char *)0x0) goto LAB_0011e5a6;
  puVar1 = &(local_278->req).setcookies;
  *puVar1 = *puVar1 + '\x01';
  goto LAB_0011e202;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                struct CookieInfo *ci,
                bool httpheader, /* TRUE if HTTP header-style line */
                bool noexpire, /* if TRUE, skip remove_expired() */
                const char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path,   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
                bool secure)  /* TRUE if connection is over secure origin */
{
  struct Cookie *co;
  size_t myhash;
  int rc;
  bool replaces = FALSE;

  DEBUGASSERT(data);
  DEBUGASSERT(MAX_SET_COOKIE_AMOUNT <= 255); /* counter is an unsigned char */
  if(data->req.setcookies >= MAX_SET_COOKIE_AMOUNT)
    return NULL;

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we are this low on memory */

  if(httpheader)
    rc = parse_cookie_header(data, co, ci, lineptr, domain, path, secure);
  else
    rc = parse_netscape(co, ci, lineptr, secure);

  if(rc)
    goto fail;

  if(co->prefix_secure && !co->secure)
    /* The __Secure- prefix only requires that the cookie be set secure */
    goto fail;

  if(co->prefix_host) {
    /*
     * The __Host- prefix requires the cookie to be secure, have a "/" path
     * and not have a domain set.
     */
    if(co->secure && co->path && strcmp(co->path, "/") == 0 && !co->tailmatch)
      ;
    else
      goto fail;
  }

  if(!ci->running &&    /* read from a file */
     ci->newsession &&  /* clean session cookies */
     !co->expires)      /* this is a session cookie since it does not expire */
    goto fail;

  co->livecookie = ci->running;
  co->creationtime = ++ci->lastct;

  /*
   * Now we have parsed the incoming line, we must now check if this supersedes
   * an already existing cookie, which it may if the previous have the same
   * domain and path as this.
   */

  /* remove expired cookies */
  if(!noexpire)
    remove_expired(ci);

  if(is_public_suffix(data, co, domain))
    goto fail;

  if(replace_existing(data, co, ci, secure, &replaces))
    goto fail;

  /* add this cookie to the list */
  myhash = cookiehash(co->domain);
  Curl_llist_append(&ci->cookielist[myhash], co, &co->node);

  if(ci->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" FMT_OFF_T,
          replaces ? "Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replaces)
    ci->numcookies++; /* one more cookie in the jar */

  /*
   * Now that we have added a new cookie to the jar, update the expiration
   * tracker in case it is the next one to expire.
   */
  if(co->expires && (co->expires < ci->next_expiration))
    ci->next_expiration = co->expires;

  return co;
fail:
  freecookie(co);
  return NULL;
}